

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
PlayerTableIRCCommand::trigger
          (PlayerTableIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view param_4)

{
  string_view color;
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 uVar5;
  ulong uVar6;
  _Fwd_list_node_base *p_Var7;
  size_type sVar8;
  size_type sVar9;
  string_view *psVar10;
  reference ppPVar11;
  char *pcVar12;
  string_view color_00;
  string_view color_01;
  __sv_type _Var13;
  basic_string_view<char,_std::char_traits<char>_> bVar14;
  size_t local_298;
  char *local_290;
  size_t local_278;
  char *local_270;
  _Self local_248;
  _Self local_240;
  iterator node_3;
  _Self local_228;
  _Self local_220;
  iterator node_2;
  _Self local_208;
  _Self local_200;
  iterator node_1;
  anon_class_64_8_03ae175d output_player;
  size_t local_198;
  char *local_190;
  string local_178;
  __sv_type local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  size_t local_138;
  size_t creditColLen;
  size_t scoreColLen;
  size_t idColLen;
  _Self local_110;
  _Self local_108;
  iterator node;
  PlayerInfo *player;
  double highCredits;
  double highScore;
  string_view *psStack_e0;
  int highID;
  size_t maxNickLen;
  forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> oPlayers;
  forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> nPlayers;
  forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> gPlayers;
  Server *server;
  uint i;
  bool noServers;
  string_view oTeam;
  string_view nTeam;
  string_view gTeam;
  string_view oTeamColor;
  string_view nTeamColor;
  string_view gTeamColor;
  int type;
  IRC_Bot *source_local;
  PlayerTableIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  pcVar12 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  Jupiter::IRC::Client::getChannel(source,nick_local._M_str,pcVar12);
  uVar5 = Jupiter::IRC::Client::Channel::getType();
  color_00 = (string_view)RenX::getTeamColor(GDI);
  color_01 = (string_view)RenX::getTeamColor(Nod);
  color = (string_view)RenX::getTeamColor(Other);
  RenX::getTeamName(GDI);
  RenX::getTeamName(Nod);
  RenX::getTeamName(Other);
  bVar1 = true;
  server._0_4_ = 0;
  while( true ) {
    RenX::getCore();
    uVar6 = RenX::Core::getServerCount();
    pcVar2 = nick_local._M_str;
    if ((uint)server == uVar6) break;
    uVar6 = RenX::getCore();
    p_Var7 = (_Fwd_list_node_base *)RenX::Core::getServer(uVar6);
    uVar6 = RenX::Server::isLogChanType((int)p_Var7);
    if ((uVar6 & 1) != 0) {
      bVar1 = false;
      sVar8 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                        ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)(p_Var7 + 2));
      sVar9 = RenX::Server::getBotCount();
      pcVar2 = nick_local._M_str;
      if (sVar8 == sVar9) {
        bVar14 = sv("No players are in-game.",0x17);
        local_278 = bVar14._M_len;
        local_270 = bVar14._M_str;
        Jupiter::IRC::Client::sendMessage(source,pcVar2,pcVar12,local_278,local_270);
      }
      else {
        std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::forward_list
                  (&nPlayers);
        std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::forward_list
                  (&oPlayers);
        std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::forward_list
                  ((forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> *)
                   &maxNickLen);
        psStack_e0 = (string_view *)0x8;
        highScore._4_4_ = 999;
        highCredits = 99999.0;
        player = (PlayerInfo *)0x416312cfe0000000;
        local_108._M_node =
             (_List_node_base *)
             std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                       ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)(p_Var7 + 2));
        while( true ) {
          local_110._M_node =
               (_List_node_base *)
               std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                         ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)(p_Var7 + 2))
          ;
          bVar3 = std::operator==(&local_108,&local_110);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          node._M_node = (_List_node_base *)
                         std::_List_iterator<RenX::PlayerInfo>::operator*(&local_108);
          if (((reference)node._M_node != (reference)0x0) &&
             ((((reference)node._M_node)->isBot & 1U) == 0)) {
            psVar10 = (string_view *)
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (&((reference)node._M_node)->name);
            if (psStack_e0 < psVar10) {
              psStack_e0 = (string_view *)
                           std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&(node._M_node)->_M_prev);
            }
            if (highScore._4_4_ < *(int *)((long)&node._M_node[0xf]._M_prev + 4)) {
              highScore._4_4_ = *(int *)((long)&node._M_node[0xf]._M_prev + 4);
            }
            if (highCredits < (double)node._M_node[0x10]._M_prev) {
              highCredits = (double)node._M_node[0x10]._M_prev;
            }
            if ((double)player < (double)node._M_node[0x11]._M_next) {
              player = (PlayerInfo *)node._M_node[0x11]._M_next;
            }
            if (*(int *)&node._M_node[0xf]._M_prev == 0) {
              std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::push_front
                        (&nPlayers,(PlayerInfo **)&node);
            }
            else if (*(int *)&node._M_node[0xf]._M_prev == 1) {
              std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::push_front
                        (&oPlayers,(PlayerInfo **)&node);
            }
            else {
              std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::push_front
                        ((forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> *)
                         &maxNickLen,(PlayerInfo **)&node);
            }
          }
          std::_List_iterator<RenX::PlayerInfo>::operator++(&local_108);
        }
        scoreColLen = 1;
        creditColLen = 1;
        local_138 = 1;
        while (highScore._4_4_ = highScore._4_4_ / 10, 0 < highScore._4_4_) {
          scoreColLen = scoreColLen + 1;
        }
        while (highCredits = highCredits / 10.0, 1.0 <= highCredits) {
          creditColLen = creditColLen + 1;
        }
        while (player = (PlayerInfo *)((double)player / 10.0), 1.0 <= (double)player) {
          local_138 = local_138 + 1;
        }
        bVar4 = RenX::Server::isAdminLogChanType((int)p_Var7);
        pcVar2 = nick_local._M_str;
        channel_local._M_len._0_4_ = channel._M_str._0_4_;
        channel_local._M_len._4_4_ = channel._M_str._4_4_;
        if ((bVar4 & 1) == 0) {
          string_printf_abi_cxx11_
                    ((string *)&output_player.creditColLen,"\x1f\x0303%*s | %*s | %*s | %*s",
                     psStack_e0,"Nickname",scoreColLen,"ID",creditColLen,"Score",local_138,"Credits"
                    );
          _Var13 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&output_player.creditColLen);
          local_198 = _Var13._M_len;
          local_190 = _Var13._M_str;
          Jupiter::IRC::Client::sendMessage(source,pcVar2,pcVar12,local_198,local_190);
          std::__cxx11::string::~string((string *)&output_player.creditColLen);
        }
        else {
          local_148 = nick_local._M_str._0_4_;
          uStack_144 = nick_local._M_str._4_4_;
          uStack_140 = (undefined4)channel_local._M_len;
          uStack_13c = channel_local._M_len._4_4_;
          string_printf_abi_cxx11_
                    (&local_178,"\x1f\x0303%*s | %*s | %*s | %*s | IP Address",psStack_e0,"Nickname"
                     ,scoreColLen,"ID",creditColLen,"Score",local_138,"Credits");
          local_158 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_178)
          ;
          Jupiter::IRC::Client::sendMessage
                    (source,CONCAT44(uStack_144,local_148),CONCAT44(uStack_13c,uStack_140),
                     local_158._M_len,local_158._M_str);
          std::__cxx11::string::~string((string *)&local_178);
        }
        output_player.source = (IRC_Bot *)&nick_local._M_str;
        output_player.channel = psStack_e0;
        output_player.maxNickLen = scoreColLen;
        output_player.idColLen = creditColLen;
        output_player.scoreColLen = local_138;
        node_1._M_node = p_Var7;
        output_player.server._0_4_ = uVar5;
        output_player._8_8_ = source;
        local_200._M_node =
             (_Fwd_list_node_base *)
             std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::begin
                       (&nPlayers);
        while( true ) {
          local_208._M_node =
               (_Fwd_list_node_base *)
               std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::end
                         (&nPlayers);
          bVar3 = std::operator==(&local_200,&local_208);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          ppPVar11 = std::_Fwd_list_iterator<RenX::PlayerInfo_*>::operator*(&local_200);
          node_2._M_node = (_Fwd_list_node_base *)color_00._M_len;
          trigger::anon_class_64_8_03ae175d::operator()
                    ((anon_class_64_8_03ae175d *)&node_1,*ppPVar11,color_00);
          std::_Fwd_list_iterator<RenX::PlayerInfo_*>::operator++(&local_200);
        }
        local_220._M_node =
             (_Fwd_list_node_base *)
             std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::begin
                       (&oPlayers);
        while( true ) {
          local_228._M_node =
               (_Fwd_list_node_base *)
               std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::end
                         (&oPlayers);
          bVar3 = std::operator==(&local_220,&local_228);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          ppPVar11 = std::_Fwd_list_iterator<RenX::PlayerInfo_*>::operator*(&local_220);
          node_3._M_node = (_Fwd_list_node_base *)color_01._M_len;
          trigger::anon_class_64_8_03ae175d::operator()
                    ((anon_class_64_8_03ae175d *)&node_1,*ppPVar11,color_01);
          std::_Fwd_list_iterator<RenX::PlayerInfo_*>::operator++(&local_220);
        }
        local_240._M_node =
             (_Fwd_list_node_base *)
             std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::begin
                       ((forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> *)
                        &maxNickLen);
        while( true ) {
          local_248._M_node =
               (_Fwd_list_node_base *)
               std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::end
                         ((forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> *)
                          &maxNickLen);
          bVar3 = std::operator==(&local_240,&local_248);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          ppPVar11 = std::_Fwd_list_iterator<RenX::PlayerInfo_*>::operator*(&local_240);
          trigger::anon_class_64_8_03ae175d::operator()
                    ((anon_class_64_8_03ae175d *)&node_1,*ppPVar11,color);
          std::_Fwd_list_iterator<RenX::PlayerInfo_*>::operator++(&local_240);
        }
        std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::~forward_list
                  ((forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> *)
                   &maxNickLen);
        std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::~forward_list
                  (&oPlayers);
        std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::~forward_list
                  (&nPlayers);
      }
    }
    server._0_4_ = (uint)server + 1;
  }
  if (bVar1) {
    bVar14 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
    local_298 = bVar14._M_len;
    local_290 = bVar14._M_str;
    Jupiter::IRC::Client::sendMessage(source,pcVar2,pcVar12,local_298,local_290);
  }
  return;
}

Assistant:

void PlayerTableIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view )
{
	int type = source->getChannel(channel)->getType();

	// Team colors
	std::string_view gTeamColor = RenX::getTeamColor(RenX::TeamType::GDI);
	std::string_view nTeamColor = RenX::getTeamColor(RenX::TeamType::Nod);
	std::string_view oTeamColor = RenX::getTeamColor(RenX::TeamType::Other);

	// Team names
	std::string_view gTeam = RenX::getTeamName(RenX::TeamType::GDI);
	std::string_view nTeam = RenX::getTeamName(RenX::TeamType::Nod);
	std::string_view oTeam = RenX::getTeamName(RenX::TeamType::Other);

	bool noServers = true;
	for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
	{
		RenX::Server *server = RenX::getCore()->getServer(i);
		if (server->isLogChanType(type))
		{
			noServers = false;
			if (server->players.size() != server->getBotCount())
			{
				std::forward_list<RenX::PlayerInfo *> gPlayers;
				std::forward_list<RenX::PlayerInfo *> nPlayers;
				std::forward_list<RenX::PlayerInfo *> oPlayers;

				size_t maxNickLen = 8;
				int highID = 999;
				double highScore = 99999.0;
				double highCredits = 9999999.0;

				RenX::PlayerInfo *player;
				for (auto node = server->players.begin(); node != server->players.end(); ++node)
				{
					player = &*node;
					if (player != nullptr && player->isBot == false)
					{
						if (player->name.size() > maxNickLen)
							maxNickLen = player->name.size();

						if (player->id > highID)
							highID = player->id;

						if (player->score > highScore)
							highScore = player->score;

						if (player->credits > highCredits)
							highCredits = player->credits;

						switch (player->team)
						{
						case RenX::TeamType::GDI:
							gPlayers.push_front(player);
							break;
						case RenX::TeamType::Nod:
							nPlayers.push_front(player);
							break;
						default:
							oPlayers.push_front(player);
							break;
						}
					}
				}

				size_t idColLen = 1, scoreColLen = 1, creditColLen = 1;

				while ((highID /= 10) > 0)
					++idColLen;

				while ((highScore /= 10) >= 1.0)
					++scoreColLen;

				while ((highCredits /= 10) >= 1.0)
					++creditColLen;

				if (server->isAdminLogChanType(type))
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s | IP Address", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));
				else
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));

				auto output_player = [server, type, source, &channel, maxNickLen, idColLen, scoreColLen, creditColLen](RenX::PlayerInfo *player, std::string_view color)
				{
					if (server->isAdminLogChanType(type))
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCNORMAL " %.*s", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits, player->ip.size(), player->ip.data()));
					else
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits));
				};

				for (auto node = gPlayers.begin(); node != gPlayers.end(); ++node)
					output_player(*node, gTeamColor);

				for (auto node = nPlayers.begin(); node != nPlayers.end(); ++node)
					output_player(*node, nTeamColor);

				for (auto node = oPlayers.begin(); node != oPlayers.end(); ++node)
					output_player(*node, oTeamColor);
			}
			else source->sendMessage(channel, "No players are in-game."sv);
		}
	}
	if (noServers)
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
}